

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

bool32 rw::ps2::rasterFromImage(Raster *raster,Image *image)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  long lVar4;
  int32 psm;
  uint32 local_8c;
  int local_70;
  int local_6c;
  int32 x;
  int32 y;
  uint8 *src;
  int tw;
  int minh;
  int minw;
  int32 i;
  uint8 *out;
  uint8 *in;
  undefined4 local_38;
  Error _e_1;
  Error _e;
  int32 pallength;
  Ps2Raster *natras;
  Image *image_local;
  Raster *raster_local;
  
  lVar4 = (long)nativeRasterOffset;
  _e.plugin = 0;
  switch(image->depth) {
  case 4:
    if (raster->format == 0x4500) {
      _e.plugin = 0x10;
LAB_00143cd7:
      if ((raster->format & 0xf00U) == 0x600) {
        in._4_4_ = 0xb00;
        local_38 = 0x8000000a;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                ,0x66f);
        pFVar2 = _stderr;
        pcVar3 = dbgsprint(0x8000000a);
        fprintf(pFVar2,"%s\n",pcVar3);
        setError((Error *)((long)&in + 4));
        return 0;
      }
      if (image->depth < 9) {
        out = image->palette;
        _minw = Raster::lockPalette(raster,5);
        memcpy(_minw,out,(long)(int)(_e.plugin << 2));
        for (minh = 0; minh < (int)_e.plugin; minh = minh + 1) {
          _minw[3] = (uint8)((ulong)(long)(int)((uint)_minw[3] << 7) / 0xff);
          _minw = _minw + 4;
        }
        Raster::unlockPalette(raster);
      }
      psm = 0x13;
      if (image->depth == 4) {
        psm = 0x14;
      }
      transferMinSize(psm,(int)*(char *)((long)&raster->pixels + lVar4 + 4),&tw,
                      (int32 *)((long)&src + 4));
      if (tw < image->width) {
        local_8c = image->width;
      }
      else {
        local_8c = tw;
      }
      src._0_4_ = local_8c;
      _x = image->pixels;
      _minw = Raster::lock(raster,0,5);
      if (image->depth == 4) {
        compressPal4(_minw,(int)(uint32)src / 2,_x,image->stride,image->width,image->height);
      }
      else if (image->depth == 8) {
        copyPal8(_minw,(uint32)src,_x,image->stride,image->width,image->height);
      }
      else {
        for (local_6c = 0; local_6c < image->height; local_6c = local_6c + 1) {
          out = _x;
          for (local_70 = 0; local_70 < image->width; local_70 = local_70 + 1) {
            iVar1 = image->depth;
            if (iVar1 == 0x10) {
              conv_ARGB1555_from_ABGR1555(_minw,out);
              _minw = _minw + 2;
            }
            else if (iVar1 == 0x18) {
              *_minw = *out;
              _minw[1] = out[1];
              _minw[2] = out[2];
              _minw[3] = 0x80;
              _minw = _minw + 4;
            }
            else if (iVar1 == 0x20) {
              *_minw = *out;
              _minw[1] = out[1];
              _minw[2] = out[2];
              _minw[3] = (uint8)((ulong)(long)(int)((uint)out[3] << 7) / 0xff);
              _minw = _minw + 4;
            }
            out = out + image->bpp;
          }
          _x = _x + image->stride;
        }
      }
      Raster::unlock(raster,0);
      return 1;
    }
    break;
  default:
    break;
  case 8:
    if (raster->format == 0x2500) {
      _e.plugin = 0x100;
      goto LAB_00143cd7;
    }
    break;
  case 0x10:
    if (raster->format == 0x100) goto LAB_00143cd7;
    break;
  case 0x18:
  case 0x20:
    if ((raster->format == 0x500) || (raster->format == 0x600)) goto LAB_00143cd7;
  }
  _e_1.plugin = 0xb00;
  _e_1.code = 0x8000000a;
  fprintf(_stderr,"%s:%d: ",
          "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
          0x669);
  pFVar2 = _stderr;
  pcVar3 = dbgsprint(0x8000000a);
  fprintf(pFVar2,"%s\n",pcVar3);
  setError(&_e_1);
  return 0;
}

Assistant:

bool32
rasterFromImage(Raster *raster, Image *image)
{
	Ps2Raster *natras = GETPS2RASTEREXT(raster);

	int32 pallength = 0;
	switch(image->depth){
	case 24:
	case 32:
		if(raster->format != Raster::C8888 &&
		   raster->format != Raster::C888)	// unsafe already
			goto err;
		break;
	case 16:
		if(raster->format != Raster::C1555) goto err;
		break;
	case 8:
		if(raster->format != (Raster::PAL8 | Raster::C8888)) goto err;
		pallength = 256;
		break;
	case 4:
		if(raster->format != (Raster::PAL4 | Raster::C8888)) goto err;
		pallength = 16;
		break;
	default:
	err:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	// unsafe
	if((raster->format&0xF00) == Raster::C888){
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	uint8 *in, *out;
	if(image->depth <= 8){
		in = image->palette;
		out = raster->lockPalette(Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		memcpy(out, in, 4*pallength);
		for(int32 i = 0; i < pallength; i++){
			out[3] = out[3]*128/255;
			out += 4;
		}
		raster->unlockPalette();
	}

	int minw, minh;
	int tw;
	transferMinSize(image->depth == 4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
	tw = max(image->width, minw);
	uint8 *src = image->pixels;
	out = raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
	if(image->depth == 4){
		compressPal4(out, tw/2, src, image->stride, image->width, image->height);
	}else if(image->depth == 8){
		copyPal8(out, tw, src, image->stride, image->width, image->height);
	}else{
		for(int32 y = 0; y < image->height; y++){
			in = src;
			for(int32 x = 0; x < image->width; x++){
				switch(image->depth){
				case 16:
					conv_ARGB1555_from_ABGR1555(out, in);
					out += 2;
					break;
				case 24:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					out[3] = 0x80;
					out += 4;
					break;
				case 32:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					out[3] = in[3]*128/255;
					out += 4;
					break;
				}
				in += image->bpp;
			}
			src += image->stride;
		}
	}
	raster->unlock(0);
	return 1;
}